

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall
test_adjacency_graph_insert_directed_Test::~test_adjacency_graph_insert_directed_Test
          (test_adjacency_graph_insert_directed_Test *this)

{
  test_adjacency_graph_insert_directed_Test *this_local;
  
  ~test_adjacency_graph_insert_directed_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, insert_directed) {
  Adjacency_Graph<true> graph;

  // insert a pentagram out of order, with some edges flipped
  EXPECT_TRUE(graph.insert({0, 1}));
  EXPECT_TRUE(graph.insert({3, 4}));
  EXPECT_TRUE(graph.insert({0, 4}));
  EXPECT_TRUE(graph.insert({2, 3}));
  EXPECT_TRUE(graph.insert({1, 2}));

  // Add three additional vertices, as an 'appendage'.
  EXPECT_TRUE(graph.insert({3, 6}));
  EXPECT_TRUE(graph.insert({5, 6}));
  EXPECT_TRUE(graph.insert({6, 0}));

  // check ascending order has been maintained.
  EXPECT_EQ(graph.size_edge(), 8);
  EXPECT_EQ(graph.size_vertex(), 7);

  // Attempt to insert an existing edge
  EXPECT_FALSE(graph.insert({1, 2}));

  // Connect across
  EXPECT_TRUE(graph.insert({0, 3}));
  EXPECT_TRUE(graph.insert({0, 2}));

  // Check graph
  EXPECT_EQ(graph.size_edge(), 10);
  EXPECT_EQ(graph.size_vertex(), 7);

  EXPECT_EQ(graph[0].size(), 4);
  EXPECT_EQ(graph[1].size(), 1);
  EXPECT_EQ(graph[2].size(), 1);
  EXPECT_EQ(graph[3].size(), 2);
  EXPECT_EQ(graph[4].size(), 0);
  EXPECT_EQ(graph[5].size(), 1);
  EXPECT_EQ(graph[6].size(), 1);
  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 2);
  EXPECT_EQ(graph[0][2], 3);
  EXPECT_EQ(graph[0][3], 4);
  EXPECT_EQ(graph[1][0], 2);
  EXPECT_EQ(graph[2][0], 3);
  EXPECT_EQ(graph[3][0], 4);
  EXPECT_EQ(graph[3][1], 6);
  EXPECT_EQ(graph[5][0], 6);
  EXPECT_EQ(graph[6][0], 0);

  // death test - invalid edge
  EXPECT_DEATH(graph.insert({1, 1}), ".*");
}